

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

int __thiscall
testing::internal::UnitTestImpl::FilterTests(UnitTestImpl *this,ReactionToSharding shard_tests)

{
  pointer ppTVar1;
  TestSuite *pTVar2;
  TestInfo *pTVar3;
  undefined8 uVar4;
  bool bVar5;
  bool bVar6;
  pointer ppTVar7;
  pointer ppTVar8;
  int iVar9;
  byte bVar10;
  int iVar11;
  ulong uVar12;
  bool bVar13;
  string local_a8;
  undefined1 local_88 [8];
  string test_name;
  int local_3c;
  int local_38;
  allocator local_31;
  
  local_3c = -1;
  local_38 = -1;
  if (shard_tests == HONOR_SHARDING_PROTOCOL) {
    local_3c = Int32FromEnvOrDie("GTEST_TOTAL_SHARDS",-1);
    local_38 = Int32FromEnvOrDie("GTEST_SHARD_INDEX",-1);
  }
  ppTVar7 = (this->test_suites_).
            super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppTVar1 = (this->test_suites_).
            super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppTVar7 == ppTVar1) {
    iVar11 = 0;
  }
  else {
    iVar9 = 0;
    iVar11 = 0;
    do {
      pTVar2 = *ppTVar7;
      std::__cxx11::string::string
                ((string *)&local_a8,(pTVar2->name_)._M_dataplus._M_p,(allocator *)local_88);
      pTVar2->should_run_ = false;
      ppTVar8 = (pTVar2->test_info_list_).
                super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((pTVar2->test_info_list_).
          super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
          super__Vector_impl_data._M_finish != ppTVar8) {
        uVar12 = 0;
        test_name.field_2._8_8_ = pTVar2;
        do {
          pTVar3 = ppTVar8[uVar12];
          std::__cxx11::string::string
                    ((string *)local_88,(pTVar3->name_)._M_dataplus._M_p,&local_31);
          bVar5 = UnitTestOptions::MatchesFilter(&local_a8,"DISABLED_*:*/DISABLED_*");
          bVar6 = true;
          if (!bVar5) {
            bVar6 = UnitTestOptions::MatchesFilter((string *)local_88,"DISABLED_*:*/DISABLED_*");
          }
          pTVar3->is_disabled_ = bVar6;
          bVar5 = UnitTestOptions::FilterMatchesTest(&local_a8,(string *)local_88);
          uVar4 = test_name.field_2._8_8_;
          pTVar3->matches_filter_ = bVar5;
          bVar13 = iVar9 % local_3c != local_38;
          bVar10 = bVar5 & (bVar6 ^ 1U | FLAGS_gtest_also_run_disabled_tests);
          pTVar3->is_in_another_shard_ = shard_tests != IGNORE_SHARDING_PROTOCOL && bVar13;
          bVar5 = (bool)((shard_tests == IGNORE_SHARDING_PROTOCOL || !bVar13) & bVar10);
          pTVar3->should_run_ = bVar5;
          *(byte *)(test_name.field_2._8_8_ + 0x70) =
               *(byte *)(test_name.field_2._8_8_ + 0x70) | bVar5;
          if (local_88 != (undefined1  [8])&test_name._M_string_length) {
            operator_delete((void *)local_88);
          }
          iVar9 = iVar9 + (uint)bVar10;
          iVar11 = iVar11 + (uint)bVar5;
          uVar12 = uVar12 + 1;
          ppTVar8 = *(pointer *)(uVar4 + 0x30);
        } while (uVar12 < (ulong)(*(long *)(uVar4 + 0x38) - (long)ppTVar8 >> 3));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p);
      }
      ppTVar7 = ppTVar7 + 1;
    } while (ppTVar7 != ppTVar1);
  }
  return iVar11;
}

Assistant:

int UnitTestImpl::FilterTests(ReactionToSharding shard_tests) {
  const int32_t total_shards = shard_tests == HONOR_SHARDING_PROTOCOL ?
      Int32FromEnvOrDie(kTestTotalShards, -1) : -1;
  const int32_t shard_index = shard_tests == HONOR_SHARDING_PROTOCOL ?
      Int32FromEnvOrDie(kTestShardIndex, -1) : -1;

  // num_runnable_tests are the number of tests that will
  // run across all shards (i.e., match filter and are not disabled).
  // num_selected_tests are the number of tests to be run on
  // this shard.
  int num_runnable_tests = 0;
  int num_selected_tests = 0;
  for (auto* test_suite : test_suites_) {
    const std::string& test_suite_name = test_suite->name();
    test_suite->set_should_run(false);

    for (size_t j = 0; j < test_suite->test_info_list().size(); j++) {
      TestInfo* const test_info = test_suite->test_info_list()[j];
      const std::string test_name(test_info->name());
      // A test is disabled if test suite name or test name matches
      // kDisableTestFilter.
      const bool is_disabled = internal::UnitTestOptions::MatchesFilter(
                                   test_suite_name, kDisableTestFilter) ||
                               internal::UnitTestOptions::MatchesFilter(
                                   test_name, kDisableTestFilter);
      test_info->is_disabled_ = is_disabled;

      const bool matches_filter = internal::UnitTestOptions::FilterMatchesTest(
          test_suite_name, test_name);
      test_info->matches_filter_ = matches_filter;

      const bool is_runnable =
          (GTEST_FLAG(also_run_disabled_tests) || !is_disabled) &&
          matches_filter;

      const bool is_in_another_shard =
          shard_tests != IGNORE_SHARDING_PROTOCOL &&
          !ShouldRunTestOnShard(total_shards, shard_index, num_runnable_tests);
      test_info->is_in_another_shard_ = is_in_another_shard;
      const bool is_selected = is_runnable && !is_in_another_shard;

      num_runnable_tests += is_runnable;
      num_selected_tests += is_selected;

      test_info->should_run_ = is_selected;
      test_suite->set_should_run(test_suite->should_run() || is_selected);
    }
  }
  return num_selected_tests;
}